

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMvIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined4 uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  int iVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  byte bVar24;
  ulong uVar25;
  ulong uVar26;
  ulong *puVar27;
  uint uVar28;
  ulong uVar29;
  long lVar30;
  ulong unaff_R15;
  size_t mask;
  uint uVar31;
  ulong uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined4 uVar52;
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 auVar56 [32];
  float fVar57;
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  float fVar61;
  float fVar62;
  float fVar63;
  undefined1 auVar60 [64];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 in_ZMM8 [64];
  uint uVar71;
  uint uVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  undefined1 auVar70 [32];
  float fVar76;
  undefined1 auVar77 [32];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  RTCFilterFunctionNArguments args;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2800 [16];
  ulong local_27f0;
  ulong local_27e8;
  ulong local_27e0;
  ulong local_27d8;
  long local_27d0;
  Scene *local_27c8;
  RTCFilterFunctionNArguments local_27c0;
  undefined1 local_2790 [16];
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  RTCHitN local_2750 [16];
  undefined1 local_2740 [16];
  undefined1 local_2730 [16];
  undefined1 local_2720 [16];
  undefined4 local_2710;
  undefined4 uStack_270c;
  undefined4 uStack_2708;
  undefined4 uStack_2704;
  undefined1 local_2700 [16];
  undefined1 local_26f0 [16];
  uint local_26e0;
  uint uStack_26dc;
  uint uStack_26d8;
  uint uStack_26d4;
  uint uStack_26d0;
  uint uStack_26cc;
  uint uStack_26c8;
  uint uStack_26c4;
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  byte local_24a0;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0;
  size_t local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  
  puVar27 = local_2390;
  local_23a0 = root.ptr;
  local_2398[0] = 0;
  auVar35 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar78 = ZEXT3264(auVar35);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar79 = ZEXT3264(auVar36);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar80 = ZEXT3264(auVar37);
  auVar33 = vmulss_avx512f(auVar35._0_16_,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar34 = vmulss_avx512f(auVar36._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  uVar52 = auVar33._0_4_;
  auVar36._4_4_ = uVar52;
  auVar36._0_4_ = uVar52;
  auVar36._8_4_ = uVar52;
  auVar36._12_4_ = uVar52;
  auVar36._16_4_ = uVar52;
  auVar36._20_4_ = uVar52;
  auVar36._24_4_ = uVar52;
  auVar36._28_4_ = uVar52;
  auVar38._0_4_ = auVar34._0_4_;
  auVar38._4_4_ = auVar38._0_4_;
  auVar38._8_4_ = auVar38._0_4_;
  auVar38._12_4_ = auVar38._0_4_;
  auVar38._16_4_ = auVar38._0_4_;
  auVar38._20_4_ = auVar38._0_4_;
  auVar38._24_4_ = auVar38._0_4_;
  auVar38._28_4_ = auVar38._0_4_;
  auVar33 = vmulss_avx512f(auVar37._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  uVar52 = auVar33._0_4_;
  auVar37._4_4_ = uVar52;
  auVar37._0_4_ = uVar52;
  auVar37._8_4_ = uVar52;
  auVar37._12_4_ = uVar52;
  auVar37._16_4_ = uVar52;
  auVar37._20_4_ = uVar52;
  auVar37._24_4_ = uVar52;
  auVar37._28_4_ = uVar52;
  local_27d8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_27e0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_27e8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_27f0 = local_27d8 ^ 0x20;
  uVar26 = local_27e0 ^ 0x20;
  iVar22 = (tray->tfar).field_0.i[k];
  auVar55 = ZEXT3264(CONCAT428(iVar22,CONCAT424(iVar22,CONCAT420(iVar22,CONCAT416(iVar22,CONCAT412(
                                                  iVar22,CONCAT48(iVar22,CONCAT44(iVar22,iVar22)))))
                                               )));
  uVar29 = local_27e8 ^ 0x20;
  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar81 = ZEXT3264(auVar35);
  auVar36 = vxorps_avx512vl(auVar36,auVar35);
  auVar82 = ZEXT3264(auVar36);
  auVar36 = vxorps_avx512vl(auVar38,auVar35);
  auVar83 = ZEXT3264(auVar36);
  auVar35 = vxorps_avx512vl(auVar37,auVar35);
  auVar84 = ZEXT3264(auVar35);
  auVar35 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar85 = ZEXT3264(auVar35);
  auVar33 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar86 = ZEXT1664(auVar33);
  auVar35 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
  auVar87 = ZEXT3264(auVar35);
  auVar35 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
  auVar88 = ZEXT3264(auVar35);
  auVar33 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
  auVar89 = ZEXT1664(auVar33);
  do {
    do {
      do {
        if (puVar27 == &local_23a0) {
          return;
        }
        pfVar1 = (float *)(puVar27 + -1);
        puVar27 = puVar27 + -2;
      } while (*(float *)(ray + k * 4 + 0x80) < *pfVar1);
      uVar32 = *puVar27;
      do {
        if ((uVar32 & 8) == 0) {
          auVar35 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar32 + 0x40 + local_27d8),auVar82._0_32_,
                               auVar78._0_32_);
          auVar36 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar32 + 0x40 + local_27e0),auVar83._0_32_,
                               auVar79._0_32_);
          auVar35 = vpmaxsd_avx2(auVar35,auVar36);
          auVar36 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar32 + 0x40 + local_27e8),auVar84._0_32_,
                               auVar80._0_32_);
          auVar36 = vpmaxsd_avx512vl(auVar36,auVar85._0_32_);
          auVar35 = vpmaxsd_avx2(auVar35,auVar36);
          in_ZMM8 = ZEXT3264(auVar35);
          auVar36 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar32 + 0x40 + local_27f0),auVar82._0_32_,
                               auVar78._0_32_);
          auVar37 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar32 + 0x40 + uVar26),auVar83._0_32_,
                               auVar79._0_32_);
          auVar36 = vpminsd_avx2(auVar36,auVar37);
          auVar37 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar32 + 0x40 + uVar29),auVar84._0_32_,
                               auVar80._0_32_);
          auVar37 = vpminsd_avx2(auVar37,auVar55._0_32_);
          auVar36 = vpminsd_avx2(auVar36,auVar37);
          uVar14 = vpcmpd_avx512vl(auVar35,auVar36,2);
          unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),(uint)(byte)uVar14);
        }
        if ((uVar32 & 8) == 0) {
          if (unaff_R15 == 0) {
            iVar22 = 4;
          }
          else {
            auVar35 = *(undefined1 (*) [32])(uVar32 & 0xfffffffffffffff0);
            auVar36 = ((undefined1 (*) [32])(uVar32 & 0xfffffffffffffff0))[1];
            auVar37 = vmovdqa64_avx512vl(auVar87._0_32_);
            auVar48 = in_ZMM8._0_32_;
            auVar37 = vpternlogd_avx512vl(auVar37,auVar48,auVar88._0_32_,0xf8);
            uVar32 = unaff_R15 & 0xffffffff;
            auVar38 = vpcompressd_avx512vl(auVar37);
            bVar10 = (bool)((byte)uVar32 & 1);
            auVar49._0_4_ = (uint)bVar10 * auVar38._0_4_ | (uint)!bVar10 * auVar37._0_4_;
            bVar10 = (bool)((byte)(uVar32 >> 1) & 1);
            auVar49._4_4_ = (uint)bVar10 * auVar38._4_4_ | (uint)!bVar10 * auVar37._4_4_;
            bVar10 = (bool)((byte)(uVar32 >> 2) & 1);
            auVar49._8_4_ = (uint)bVar10 * auVar38._8_4_ | (uint)!bVar10 * auVar37._8_4_;
            bVar10 = (bool)((byte)(uVar32 >> 3) & 1);
            auVar49._12_4_ = (uint)bVar10 * auVar38._12_4_ | (uint)!bVar10 * auVar37._12_4_;
            bVar10 = (bool)((byte)(uVar32 >> 4) & 1);
            auVar49._16_4_ = (uint)bVar10 * auVar38._16_4_ | (uint)!bVar10 * auVar37._16_4_;
            bVar10 = (bool)((byte)(uVar32 >> 5) & 1);
            auVar49._20_4_ = (uint)bVar10 * auVar38._20_4_ | (uint)!bVar10 * auVar37._20_4_;
            bVar10 = (bool)((byte)(uVar32 >> 6) & 1);
            auVar49._24_4_ = (uint)bVar10 * auVar38._24_4_ | (uint)!bVar10 * auVar37._24_4_;
            bVar10 = (bool)((byte)(uVar32 >> 7) & 1);
            auVar49._28_4_ = (uint)bVar10 * auVar38._28_4_ | (uint)!bVar10 * auVar37._28_4_;
            auVar37 = vpermt2q_avx512vl(auVar35,auVar49,auVar36);
            uVar32 = auVar37._0_8_;
            iVar21 = 0;
            uVar25 = unaff_R15 - 1 & unaff_R15;
            iVar22 = 0;
            if (uVar25 != 0) {
              auVar37 = vpshufd_avx2(auVar49,0x55);
              vpermt2q_avx512vl(auVar35,auVar37,auVar36);
              auVar38 = vpminsd_avx2(auVar49,auVar37);
              auVar37 = vpmaxsd_avx2(auVar49,auVar37);
              uVar25 = uVar25 - 1 & uVar25;
              iVar22 = iVar21;
              if (uVar25 == 0) {
                auVar38 = vpermi2q_avx512vl(auVar38,auVar35,auVar36);
                uVar32 = auVar38._0_8_;
                auVar35 = vpermt2q_avx512vl(auVar35,auVar37,auVar36);
                *puVar27 = auVar35._0_8_;
                auVar35 = vpermd_avx2(auVar37,auVar48);
                *(int *)(puVar27 + 1) = auVar35._0_4_;
                puVar27 = puVar27 + 2;
              }
              else {
                auVar40 = vpshufd_avx2(auVar49,0xaa);
                vpermt2q_avx512vl(auVar35,auVar40,auVar36);
                auVar39 = vpminsd_avx2(auVar38,auVar40);
                auVar38 = vpmaxsd_avx2(auVar38,auVar40);
                auVar40 = vpminsd_avx2(auVar37,auVar38);
                auVar37 = vpmaxsd_avx2(auVar37,auVar38);
                uVar25 = uVar25 - 1 & uVar25;
                if (uVar25 == 0) {
                  auVar38 = vpermi2q_avx512vl(auVar39,auVar35,auVar36);
                  uVar32 = auVar38._0_8_;
                  auVar38 = vpermt2q_avx512vl(auVar35,auVar37,auVar36);
                  *puVar27 = auVar38._0_8_;
                  auVar37 = vpermd_avx2(auVar37,auVar48);
                  *(int *)(puVar27 + 1) = auVar37._0_4_;
                  auVar35 = vpermt2q_avx512vl(auVar35,auVar40,auVar36);
                  puVar27[2] = auVar35._0_8_;
                  auVar35 = vpermd_avx2(auVar40,auVar48);
                  *(int *)(puVar27 + 3) = auVar35._0_4_;
                  puVar27 = puVar27 + 4;
                }
                else {
                  auVar38 = vpshufd_avx2(auVar49,0xff);
                  vpermt2q_avx512vl(auVar35,auVar38,auVar36);
                  auVar41 = vpminsd_avx2(auVar39,auVar38);
                  auVar38 = vpmaxsd_avx2(auVar39,auVar38);
                  auVar39 = vpminsd_avx2(auVar40,auVar38);
                  auVar38 = vpmaxsd_avx2(auVar40,auVar38);
                  auVar40 = vpminsd_avx2(auVar37,auVar38);
                  auVar37 = vpmaxsd_avx2(auVar37,auVar38);
                  uVar25 = uVar25 - 1 & uVar25;
                  if (uVar25 == 0) {
                    auVar38 = vpermi2q_avx512vl(auVar41,auVar35,auVar36);
                    uVar32 = auVar38._0_8_;
                    auVar38 = vpermt2q_avx512vl(auVar35,auVar37,auVar36);
                    *puVar27 = auVar38._0_8_;
                    in_ZMM8 = ZEXT3264(auVar48);
                    auVar37 = vpermd_avx2(auVar37,auVar48);
                    *(int *)(puVar27 + 1) = auVar37._0_4_;
                    auVar37 = vpermt2q_avx512vl(auVar35,auVar40,auVar36);
                    puVar27[2] = auVar37._0_8_;
                    auVar37 = vpermd_avx2(auVar40,auVar48);
                    *(int *)(puVar27 + 3) = auVar37._0_4_;
                    auVar35 = vpermt2q_avx512vl(auVar35,auVar39,auVar36);
                    puVar27[4] = auVar35._0_8_;
                    auVar35 = vpermd_avx2(auVar39,auVar48);
                    *(int *)(puVar27 + 5) = auVar35._0_4_;
                    puVar27 = puVar27 + 6;
                  }
                  else {
                    auVar42 = valignd_avx512vl(auVar49,auVar49,3);
                    auVar49 = vmovdqa64_avx512vl(auVar89._0_32_);
                    auVar38 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                    auVar49 = vpermt2d_avx512vl(auVar49,auVar38,auVar41);
                    auVar38 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                    auVar49 = vpermt2d_avx512vl(auVar49,auVar38,auVar39);
                    auVar49 = vpermt2d_avx512vl(auVar49,auVar38,auVar40);
                    auVar38 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                    auVar37 = vpermt2d_avx512vl(auVar49,auVar38,auVar37);
                    auVar60 = ZEXT3264(auVar37);
                    uVar32 = uVar25;
                    do {
                      auVar38 = auVar60._0_32_;
                      auVar40._8_4_ = 1;
                      auVar40._0_8_ = 0x100000001;
                      auVar40._12_4_ = 1;
                      auVar40._16_4_ = 1;
                      auVar40._20_4_ = 1;
                      auVar40._24_4_ = 1;
                      auVar40._28_4_ = 1;
                      auVar37 = vpermd_avx2(auVar40,auVar42);
                      auVar42 = valignd_avx512vl(auVar42,auVar42,1);
                      vpermt2q_avx512vl(auVar35,auVar42,auVar36);
                      uVar32 = uVar32 - 1 & uVar32;
                      uVar14 = vpcmpd_avx512vl(auVar37,auVar38,5);
                      auVar37 = vpmaxsd_avx2(auVar37,auVar38);
                      bVar24 = (byte)uVar14 << 1;
                      auVar38 = valignd_avx512vl(auVar38,auVar38,7);
                      bVar10 = (bool)((byte)uVar14 & 1);
                      auVar39._4_4_ = (uint)bVar10 * auVar38._4_4_ | (uint)!bVar10 * auVar37._4_4_;
                      auVar39._0_4_ = auVar37._0_4_;
                      bVar10 = (bool)(bVar24 >> 2 & 1);
                      auVar39._8_4_ = (uint)bVar10 * auVar38._8_4_ | (uint)!bVar10 * auVar37._8_4_;
                      bVar10 = (bool)(bVar24 >> 3 & 1);
                      auVar39._12_4_ =
                           (uint)bVar10 * auVar38._12_4_ | (uint)!bVar10 * auVar37._12_4_;
                      bVar10 = (bool)(bVar24 >> 4 & 1);
                      auVar39._16_4_ =
                           (uint)bVar10 * auVar38._16_4_ | (uint)!bVar10 * auVar37._16_4_;
                      bVar10 = (bool)(bVar24 >> 5 & 1);
                      auVar39._20_4_ =
                           (uint)bVar10 * auVar38._20_4_ | (uint)!bVar10 * auVar37._20_4_;
                      bVar10 = (bool)(bVar24 >> 6 & 1);
                      auVar39._24_4_ =
                           (uint)bVar10 * auVar38._24_4_ | (uint)!bVar10 * auVar37._24_4_;
                      auVar39._28_4_ =
                           (uint)(bVar24 >> 7) * auVar38._28_4_ |
                           (uint)!(bool)(bVar24 >> 7) * auVar37._28_4_;
                      auVar60 = ZEXT3264(auVar39);
                    } while (uVar32 != 0);
                    lVar30 = POPCOUNT(uVar25) + 3;
                    do {
                      auVar37 = vpermi2q_avx512vl(auVar39,auVar35,auVar36);
                      *puVar27 = auVar37._0_8_;
                      auVar38 = auVar60._0_32_;
                      auVar37 = vpermd_avx2(auVar38,auVar48);
                      *(int *)(puVar27 + 1) = auVar37._0_4_;
                      auVar39 = valignd_avx512vl(auVar38,auVar38,1);
                      puVar27 = puVar27 + 2;
                      auVar60 = ZEXT3264(auVar39);
                      lVar30 = lVar30 + -1;
                    } while (lVar30 != 0);
                    auVar35 = vpermt2q_avx512vl(auVar35,auVar39,auVar36);
                    uVar32 = auVar35._0_8_;
                    in_ZMM8 = ZEXT3264(auVar48);
                  }
                }
              }
            }
          }
        }
        else {
          iVar22 = 6;
        }
      } while (iVar22 == 0);
    } while (iVar22 != 6);
    local_25c0 = in_ZMM8._0_32_;
    local_27d0 = (ulong)((uint)uVar32 & 0xf) - 8;
    if (local_27d0 != 0) {
      uVar32 = uVar32 & 0xfffffffffffffff0;
      lVar30 = 0;
      do {
        lVar23 = lVar30 * 0xe0;
        lVar2 = uVar32 + 0xd0 + lVar23;
        local_2780 = *(undefined8 *)(lVar2 + 0x10);
        uStack_2778 = *(undefined8 *)(lVar2 + 0x18);
        lVar2 = uVar32 + 0xc0 + lVar23;
        local_25a0 = *(undefined8 *)(lVar2 + 0x10);
        uStack_2598 = *(undefined8 *)(lVar2 + 0x18);
        uStack_2590 = local_25a0;
        uStack_2588 = uStack_2598;
        uStack_2770 = local_2780;
        uStack_2768 = uStack_2778;
        auVar58._16_16_ = *(undefined1 (*) [16])(uVar32 + 0x60 + lVar23);
        auVar58._0_16_ = *(undefined1 (*) [16])(uVar32 + lVar23);
        auVar64._16_16_ = *(undefined1 (*) [16])(uVar32 + 0x70 + lVar23);
        auVar64._0_16_ = *(undefined1 (*) [16])(uVar32 + 0x10 + lVar23);
        auVar65._16_16_ = *(undefined1 (*) [16])(uVar32 + 0x80 + lVar23);
        auVar65._0_16_ = *(undefined1 (*) [16])(uVar32 + 0x20 + lVar23);
        auVar33 = *(undefined1 (*) [16])(uVar32 + 0x30 + lVar23);
        auVar35._16_16_ = auVar33;
        auVar35._0_16_ = auVar33;
        auVar34 = *(undefined1 (*) [16])(uVar32 + 0x40 + lVar23);
        auVar48._16_16_ = auVar34;
        auVar48._0_16_ = auVar34;
        auVar3 = *(undefined1 (*) [16])(uVar32 + 0x50 + lVar23);
        auVar56._16_16_ = auVar3;
        auVar56._0_16_ = auVar3;
        auVar4 = *(undefined1 (*) [16])(uVar32 + 0x90 + lVar23);
        auVar66._16_16_ = auVar4;
        auVar66._0_16_ = auVar4;
        auVar4 = *(undefined1 (*) [16])(uVar32 + 0xa0 + lVar23);
        auVar67._16_16_ = auVar4;
        auVar67._0_16_ = auVar4;
        auVar4 = *(undefined1 (*) [16])(uVar32 + 0xb0 + lVar23);
        auVar68._16_16_ = auVar4;
        auVar68._0_16_ = auVar4;
        auVar35 = vsubps_avx(auVar58,auVar35);
        auVar36 = vsubps_avx(auVar64,auVar48);
        auVar37 = vsubps_avx(auVar65,auVar56);
        auVar38 = vsubps_avx(auVar66,auVar58);
        auVar49 = vsubps_avx(auVar67,auVar64);
        auVar48 = vsubps_avx(auVar68,auVar65);
        auVar45._4_4_ = auVar36._4_4_ * auVar48._4_4_;
        auVar45._0_4_ = auVar36._0_4_ * auVar48._0_4_;
        auVar45._8_4_ = auVar36._8_4_ * auVar48._8_4_;
        auVar45._12_4_ = auVar36._12_4_ * auVar48._12_4_;
        auVar45._16_4_ = auVar36._16_4_ * auVar48._16_4_;
        auVar45._20_4_ = auVar36._20_4_ * auVar48._20_4_;
        auVar45._24_4_ = auVar36._24_4_ * auVar48._24_4_;
        auVar45._28_4_ = auVar33._12_4_;
        auVar4 = vfmsub231ps_fma(auVar45,auVar49,auVar37);
        auVar46._4_4_ = auVar37._4_4_ * auVar38._4_4_;
        auVar46._0_4_ = auVar37._0_4_ * auVar38._0_4_;
        auVar46._8_4_ = auVar37._8_4_ * auVar38._8_4_;
        auVar46._12_4_ = auVar37._12_4_ * auVar38._12_4_;
        auVar46._16_4_ = auVar37._16_4_ * auVar38._16_4_;
        auVar46._20_4_ = auVar37._20_4_ * auVar38._20_4_;
        auVar46._24_4_ = auVar37._24_4_ * auVar38._24_4_;
        auVar46._28_4_ = auVar34._12_4_;
        auVar34 = vfmsub231ps_fma(auVar46,auVar48,auVar35);
        auVar47._4_4_ = auVar35._4_4_ * auVar49._4_4_;
        auVar47._0_4_ = auVar35._0_4_ * auVar49._0_4_;
        auVar47._8_4_ = auVar35._8_4_ * auVar49._8_4_;
        auVar47._12_4_ = auVar35._12_4_ * auVar49._12_4_;
        auVar47._16_4_ = auVar35._16_4_ * auVar49._16_4_;
        auVar47._20_4_ = auVar35._20_4_ * auVar49._20_4_;
        auVar47._24_4_ = auVar35._24_4_ * auVar49._24_4_;
        auVar47._28_4_ = auVar3._12_4_;
        uVar52 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar70._4_4_ = uVar52;
        auVar70._0_4_ = uVar52;
        auVar70._8_4_ = uVar52;
        auVar70._12_4_ = uVar52;
        auVar70._16_4_ = uVar52;
        auVar70._20_4_ = uVar52;
        auVar70._24_4_ = uVar52;
        auVar70._28_4_ = uVar52;
        auVar39 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
        auVar40 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
        uVar52 = *(undefined4 *)(ray + k * 4);
        auVar41._4_4_ = uVar52;
        auVar41._0_4_ = uVar52;
        auVar41._8_4_ = uVar52;
        auVar41._12_4_ = uVar52;
        auVar41._16_4_ = uVar52;
        auVar41._20_4_ = uVar52;
        auVar41._24_4_ = uVar52;
        auVar41._28_4_ = uVar52;
        auVar41 = vsubps_avx512vl(auVar58,auVar41);
        auVar3 = vfmsub231ps_fma(auVar47,auVar38,auVar36);
        uVar52 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar42._4_4_ = uVar52;
        auVar42._0_4_ = uVar52;
        auVar42._8_4_ = uVar52;
        auVar42._12_4_ = uVar52;
        auVar42._16_4_ = uVar52;
        auVar42._20_4_ = uVar52;
        auVar42._24_4_ = uVar52;
        auVar42._28_4_ = uVar52;
        auVar42 = vsubps_avx512vl(auVar64,auVar42);
        uVar52 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar43._4_4_ = uVar52;
        auVar43._0_4_ = uVar52;
        auVar43._8_4_ = uVar52;
        auVar43._12_4_ = uVar52;
        auVar43._16_4_ = uVar52;
        auVar43._20_4_ = uVar52;
        auVar43._24_4_ = uVar52;
        auVar43._28_4_ = uVar52;
        auVar43 = vsubps_avx512vl(auVar65,auVar43);
        auVar44 = vmulps_avx512vl(auVar39,auVar43);
        auVar45 = vfmsub231ps_avx512vl(auVar44,auVar42,auVar40);
        auVar44 = vmulps_avx512vl(auVar40,auVar41);
        auVar46 = vfmsub231ps_avx512vl(auVar44,auVar43,auVar70);
        auVar44 = vmulps_avx512vl(auVar70,auVar42);
        auVar47 = vfmsub231ps_avx512vl(auVar44,auVar41,auVar39);
        auVar40 = vmulps_avx512vl(ZEXT1632(auVar3),auVar40);
        auVar39 = vfmadd231ps_avx512vl(auVar40,ZEXT1632(auVar34),auVar39);
        local_2520 = vfmadd231ps_avx512vl(auVar39,ZEXT1632(auVar4),auVar70);
        auVar44._8_4_ = 0x7fffffff;
        auVar44._0_8_ = 0x7fffffff7fffffff;
        auVar44._12_4_ = 0x7fffffff;
        auVar44._16_4_ = 0x7fffffff;
        auVar44._20_4_ = 0x7fffffff;
        auVar44._24_4_ = 0x7fffffff;
        auVar44._28_4_ = 0x7fffffff;
        vandps_avx512vl(local_2520,auVar44);
        vandps_avx512vl(local_2520,auVar81._0_32_);
        auVar48 = vmulps_avx512vl(auVar48,auVar47);
        auVar49 = vfmadd231ps_avx512vl(auVar48,auVar46,auVar49);
        auVar33 = vfmadd231ps_fma(auVar49,auVar45,auVar38);
        uVar31 = local_2520._0_4_;
        local_2580._0_4_ = (float)(uVar31 ^ auVar33._0_4_);
        uVar71 = local_2520._4_4_;
        local_2580._4_4_ = (float)(uVar71 ^ auVar33._4_4_);
        uVar72 = local_2520._8_4_;
        local_2580._8_4_ = (float)(uVar72 ^ auVar33._8_4_);
        uVar28 = local_2520._12_4_;
        local_2580._12_4_ = (float)(uVar28 ^ auVar33._12_4_);
        fVar73 = local_2520._16_4_;
        local_2580._16_4_ = fVar73;
        fVar74 = local_2520._20_4_;
        local_2580._20_4_ = fVar74;
        fVar75 = local_2520._24_4_;
        local_2580._24_4_ = fVar75;
        fVar76 = local_2520._28_4_;
        local_2580._28_4_ = fVar76;
        auVar37 = vmulps_avx512vl(auVar37,auVar47);
        auVar36 = vfmadd231ps_avx512vl(auVar37,auVar36,auVar46);
        auVar33 = vfmadd231ps_fma(auVar36,auVar35,auVar45);
        local_2560._0_4_ = (float)(uVar31 ^ auVar33._0_4_);
        local_2560._4_4_ = (float)(uVar71 ^ auVar33._4_4_);
        local_2560._8_4_ = (float)(uVar72 ^ auVar33._8_4_);
        local_2560._12_4_ = (float)(uVar28 ^ auVar33._12_4_);
        local_2560._16_4_ = fVar73;
        local_2560._20_4_ = fVar74;
        local_2560._24_4_ = fVar75;
        local_2560._28_4_ = fVar76;
        uVar14 = vcmpps_avx512vl(local_2580,ZEXT832(0) << 0x20,5);
        uVar11 = vcmpps_avx512vl(local_2560,ZEXT832(0) << 0x20,5);
        uVar12 = vcmpps_avx512vl(local_2520,ZEXT832(0) << 0x20,4);
        auVar77._0_4_ = local_2580._0_4_ + local_2560._0_4_;
        auVar77._4_4_ = local_2580._4_4_ + local_2560._4_4_;
        auVar77._8_4_ = local_2580._8_4_ + local_2560._8_4_;
        auVar77._12_4_ = local_2580._12_4_ + local_2560._12_4_;
        auVar77._16_4_ = fVar73 + fVar73;
        auVar77._20_4_ = fVar74 + fVar74;
        auVar77._24_4_ = fVar75 + fVar75;
        auVar77._28_4_ = fVar76 + fVar76;
        uVar13 = vcmpps_avx512vl(auVar77,local_2520,2);
        local_24a0 = (byte)uVar14 & (byte)uVar11 & (byte)uVar12 & (byte)uVar13;
        if (local_24a0 != 0) {
          auVar18._4_4_ = auVar43._4_4_ * auVar3._4_4_;
          auVar18._0_4_ = auVar43._0_4_ * auVar3._0_4_;
          auVar18._8_4_ = auVar43._8_4_ * auVar3._8_4_;
          auVar18._12_4_ = auVar43._12_4_ * auVar3._12_4_;
          auVar18._16_4_ = auVar43._16_4_ * 0.0;
          auVar18._20_4_ = auVar43._20_4_ * 0.0;
          auVar18._24_4_ = auVar43._24_4_ * 0.0;
          auVar18._28_4_ = auVar43._28_4_;
          auVar33 = vfmadd213ps_fma(auVar42,ZEXT1632(auVar34),auVar18);
          auVar33 = vfmadd213ps_fma(auVar41,ZEXT1632(auVar4),ZEXT1632(auVar33));
          local_2540._0_4_ = (float)(uVar31 ^ auVar33._0_4_);
          local_2540._4_4_ = (float)(uVar71 ^ auVar33._4_4_);
          local_2540._8_4_ = (float)(uVar72 ^ auVar33._8_4_);
          local_2540._12_4_ = (float)(uVar28 ^ auVar33._12_4_);
          local_2540._16_4_ = fVar73;
          local_2540._20_4_ = fVar74;
          local_2540._24_4_ = fVar75;
          local_2540._28_4_ = fVar76;
          uVar52 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar15._4_4_ = uVar52;
          auVar15._0_4_ = uVar52;
          auVar15._8_4_ = uVar52;
          auVar15._12_4_ = uVar52;
          auVar15._16_4_ = uVar52;
          auVar15._20_4_ = uVar52;
          auVar15._24_4_ = uVar52;
          auVar15._28_4_ = uVar52;
          auVar35 = vmulps_avx512vl(local_2520,auVar15);
          uVar14 = vcmpps_avx512vl(auVar35,local_2540,1);
          uVar52 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar16._4_4_ = uVar52;
          auVar16._0_4_ = uVar52;
          auVar16._8_4_ = uVar52;
          auVar16._12_4_ = uVar52;
          auVar16._16_4_ = uVar52;
          auVar16._20_4_ = uVar52;
          auVar16._24_4_ = uVar52;
          auVar16._28_4_ = uVar52;
          auVar35 = vmulps_avx512vl(local_2520,auVar16);
          uVar11 = vcmpps_avx512vl(local_2540,auVar35,2);
          local_24a0 = (byte)uVar14 & (byte)uVar11 & local_24a0;
          uVar31 = (uint)local_24a0;
          if (local_24a0 != 0) {
            local_2500 = ZEXT1632(auVar4);
            local_24e0 = ZEXT1632(auVar34);
            local_24c0 = ZEXT1632(auVar3);
            local_23c0 = 0xf0;
            local_27c8 = context->scene;
            auVar35 = vrcp14ps_avx512vl(local_2520);
            auVar69._8_4_ = 0x3f800000;
            auVar69._0_8_ = &DAT_3f8000003f800000;
            auVar69._12_4_ = 0x3f800000;
            auVar69._16_4_ = 0x3f800000;
            auVar69._20_4_ = 0x3f800000;
            auVar69._24_4_ = 0x3f800000;
            auVar69._28_4_ = 0x3f800000;
            auVar33 = vfnmadd213ps_fma(local_2520,auVar35,auVar69);
            auVar33 = vfmadd132ps_fma(ZEXT1632(auVar33),auVar35,auVar35);
            fVar57 = auVar33._0_4_;
            fVar61 = auVar33._4_4_;
            local_2440._4_4_ = fVar61 * local_2540._4_4_;
            local_2440._0_4_ = fVar57 * local_2540._0_4_;
            fVar62 = auVar33._8_4_;
            local_2440._8_4_ = fVar62 * local_2540._8_4_;
            fVar63 = auVar33._12_4_;
            local_2440._12_4_ = fVar63 * local_2540._12_4_;
            local_2440._16_4_ = fVar73 * 0.0;
            local_2440._20_4_ = fVar74 * 0.0;
            local_2440._24_4_ = fVar75 * 0.0;
            local_2440._28_4_ = auVar35._28_4_;
            auVar55 = ZEXT3264(local_2440);
            auVar19._4_4_ = fVar61 * local_2580._4_4_;
            auVar19._0_4_ = fVar57 * local_2580._0_4_;
            auVar19._8_4_ = fVar62 * local_2580._8_4_;
            auVar19._12_4_ = fVar63 * local_2580._12_4_;
            auVar19._16_4_ = fVar73 * 0.0;
            auVar19._20_4_ = fVar74 * 0.0;
            auVar19._24_4_ = fVar75 * 0.0;
            auVar19._28_4_ = fVar76;
            auVar35 = vminps_avx(auVar19,auVar69);
            auVar59._0_4_ = fVar57 * local_2560._0_4_;
            auVar59._4_4_ = fVar61 * local_2560._4_4_;
            auVar59._8_4_ = fVar62 * local_2560._8_4_;
            auVar59._12_4_ = fVar63 * local_2560._12_4_;
            auVar59._16_4_ = fVar73 * 0.0;
            auVar59._20_4_ = fVar74 * 0.0;
            auVar59._24_4_ = fVar75 * 0.0;
            auVar59._28_4_ = 0;
            auVar36 = vminps_avx(auVar59,auVar69);
            auVar37 = vsubps_avx(auVar69,auVar35);
            auVar38 = vsubps_avx(auVar69,auVar36);
            local_2460 = vblendps_avx(auVar36,auVar37,0xf0);
            local_2480 = vblendps_avx(auVar35,auVar38,0xf0);
            fVar73 = (float)DAT_02060940;
            local_2420._0_4_ = auVar4._0_4_ * fVar73;
            fVar74 = DAT_02060940._4_4_;
            local_2420._4_4_ = auVar4._4_4_ * fVar74;
            fVar75 = DAT_02060940._8_4_;
            local_2420._8_4_ = auVar4._8_4_ * fVar75;
            fVar76 = DAT_02060940._12_4_;
            local_2420._12_4_ = auVar4._12_4_ * fVar76;
            fVar57 = DAT_02060940._16_4_;
            local_2420._16_4_ = fVar57 * 0.0;
            fVar61 = DAT_02060940._20_4_;
            local_2420._20_4_ = fVar61 * 0.0;
            fVar62 = DAT_02060940._24_4_;
            local_2420._24_4_ = fVar62 * 0.0;
            local_2420._28_4_ = 0;
            local_2400._0_4_ = auVar34._0_4_ * fVar73;
            local_2400._4_4_ = auVar34._4_4_ * fVar74;
            local_2400._8_4_ = auVar34._8_4_ * fVar75;
            local_2400._12_4_ = auVar34._12_4_ * fVar76;
            local_2400._16_4_ = fVar57 * 0.0;
            local_2400._20_4_ = fVar61 * 0.0;
            local_2400._24_4_ = fVar62 * 0.0;
            local_2400._28_4_ = 0;
            local_23e0._4_4_ = auVar3._4_4_ * fVar74;
            local_23e0._0_4_ = auVar3._0_4_ * fVar73;
            local_23e0._8_4_ = auVar3._8_4_ * fVar75;
            local_23e0._12_4_ = auVar3._12_4_ * fVar76;
            local_23e0._16_4_ = fVar57 * 0.0;
            local_23e0._20_4_ = fVar61 * 0.0;
            local_23e0._24_4_ = fVar62 * 0.0;
            local_23e0._28_4_ = 0;
            auVar53._8_4_ = 0x7f800000;
            auVar53._0_8_ = 0x7f8000007f800000;
            auVar53._12_4_ = 0x7f800000;
            auVar53._16_4_ = 0x7f800000;
            auVar53._20_4_ = 0x7f800000;
            auVar53._24_4_ = 0x7f800000;
            auVar53._28_4_ = 0x7f800000;
            auVar35 = vblendmps_avx512vl(auVar53,local_2440);
            auVar50._0_4_ =
                 (uint)(local_24a0 & 1) * auVar35._0_4_ | (uint)!(bool)(local_24a0 & 1) * 0x7f800000
            ;
            bVar10 = (bool)(local_24a0 >> 1 & 1);
            auVar50._4_4_ = (uint)bVar10 * auVar35._4_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(local_24a0 >> 2 & 1);
            auVar50._8_4_ = (uint)bVar10 * auVar35._8_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(local_24a0 >> 3 & 1);
            auVar50._12_4_ = (uint)bVar10 * auVar35._12_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(local_24a0 >> 4 & 1);
            auVar50._16_4_ = (uint)bVar10 * auVar35._16_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(local_24a0 >> 5 & 1);
            auVar50._20_4_ = (uint)bVar10 * auVar35._20_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(local_24a0 >> 6 & 1);
            auVar50._24_4_ = (uint)bVar10 * auVar35._24_4_ | (uint)!bVar10 * 0x7f800000;
            auVar50._28_4_ =
                 (uint)(local_24a0 >> 7) * auVar35._28_4_ |
                 (uint)!(bool)(local_24a0 >> 7) * 0x7f800000;
            auVar35 = vshufps_avx(auVar50,auVar50,0xb1);
            auVar35 = vminps_avx(auVar50,auVar35);
            auVar36 = vshufpd_avx(auVar35,auVar35,5);
            auVar35 = vminps_avx(auVar35,auVar36);
            auVar36 = vpermpd_avx2(auVar35,0x4e);
            auVar35 = vminps_avx(auVar35,auVar36);
            uVar14 = vcmpps_avx512vl(auVar50,auVar35,0);
            bVar24 = (byte)uVar14 & local_24a0;
            do {
              uVar71 = uVar31;
              if (bVar24 != 0) {
                uVar71 = (uint)bVar24;
              }
              uVar72 = 0;
              for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
                uVar72 = uVar72 + 1;
              }
              uVar28 = uVar72 & 0xff;
              uVar71 = *(uint *)((long)&local_25a0 + (ulong)uVar28 * 4);
              pGVar6 = (local_27c8->geometries).items[uVar71].ptr;
              if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                uVar31 = (uint)(byte)(~(byte)(1 << (uVar72 & 0x1f)) & (byte)uVar31);
                bVar10 = true;
              }
              else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                      (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                bVar10 = false;
              }
              else {
                local_26c0 = auVar55._0_32_;
                local_26a0 = vmovdqa64_avx512vl(auVar85._0_32_);
                local_2680 = auVar84._0_32_;
                local_2660 = auVar83._0_32_;
                local_2640 = auVar82._0_32_;
                local_2620 = auVar80._0_32_;
                local_2600 = auVar79._0_32_;
                local_25e0 = auVar78._0_32_;
                uVar25 = (ulong)(uVar28 * 4);
                uVar52 = *(undefined4 *)(local_2480 + uVar25);
                local_2720._4_4_ = uVar52;
                local_2720._0_4_ = uVar52;
                local_2720._8_4_ = uVar52;
                local_2720._12_4_ = uVar52;
                local_2710 = *(undefined4 *)(local_2460 + uVar25);
                local_26f0 = vpbroadcastd_avx512vl();
                uVar52 = *(undefined4 *)((long)&local_2780 + uVar25);
                local_2700._4_4_ = uVar52;
                local_2700._0_4_ = uVar52;
                local_2700._8_4_ = uVar52;
                local_2700._12_4_ = uVar52;
                uVar52 = *(undefined4 *)(local_2420 + uVar25);
                uVar5 = *(undefined4 *)(local_2400 + uVar25);
                local_2740._4_4_ = uVar5;
                local_2740._0_4_ = uVar5;
                local_2740._8_4_ = uVar5;
                local_2740._12_4_ = uVar5;
                uVar5 = *(undefined4 *)(local_23e0 + uVar25);
                local_2730._4_4_ = uVar5;
                local_2730._0_4_ = uVar5;
                local_2730._8_4_ = uVar5;
                local_2730._12_4_ = uVar5;
                local_2750[0] = (RTCHitN)(char)uVar52;
                local_2750[1] = (RTCHitN)(char)((uint)uVar52 >> 8);
                local_2750[2] = (RTCHitN)(char)((uint)uVar52 >> 0x10);
                local_2750[3] = (RTCHitN)(char)((uint)uVar52 >> 0x18);
                local_2750[4] = (RTCHitN)(char)uVar52;
                local_2750[5] = (RTCHitN)(char)((uint)uVar52 >> 8);
                local_2750[6] = (RTCHitN)(char)((uint)uVar52 >> 0x10);
                local_2750[7] = (RTCHitN)(char)((uint)uVar52 >> 0x18);
                local_2750[8] = (RTCHitN)(char)uVar52;
                local_2750[9] = (RTCHitN)(char)((uint)uVar52 >> 8);
                local_2750[10] = (RTCHitN)(char)((uint)uVar52 >> 0x10);
                local_2750[0xb] = (RTCHitN)(char)((uint)uVar52 >> 0x18);
                local_2750[0xc] = (RTCHitN)(char)uVar52;
                local_2750[0xd] = (RTCHitN)(char)((uint)uVar52 >> 8);
                local_2750[0xe] = (RTCHitN)(char)((uint)uVar52 >> 0x10);
                local_2750[0xf] = (RTCHitN)(char)((uint)uVar52 >> 0x18);
                uStack_270c = local_2710;
                uStack_2708 = local_2710;
                uStack_2704 = local_2710;
                vpcmpeqd_avx2(ZEXT1632(local_2720),ZEXT1632(local_2720));
                uStack_26dc = context->user->instID[0];
                local_26e0 = uStack_26dc;
                uStack_26d8 = uStack_26dc;
                uStack_26d4 = uStack_26dc;
                uStack_26d0 = context->user->instPrimID[0];
                uStack_26cc = uStack_26d0;
                uStack_26c8 = uStack_26d0;
                uStack_26c4 = uStack_26d0;
                uVar52 = *(undefined4 *)(ray + k * 4 + 0x80);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2440 + uVar25);
                local_2790 = vmovdqa64_avx512vl(auVar86._0_16_);
                local_2800 = vmovdqa64_avx512vl(auVar86._0_16_);
                local_27c0.valid = (int *)local_2800;
                local_27c0.geometryUserPtr = pGVar6->userPtr;
                local_27c0.context = context->user;
                local_27c0.hit = local_2750;
                local_27c0.N = 4;
                local_27c0.ray = (RTCRayN *)ray;
                if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar6->intersectionFilterN)(&local_27c0);
                }
                uVar25 = vptestmd_avx512vl(local_2800,local_2800);
                if ((uVar25 & 0xf) == 0) {
LAB_00846a22:
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar52;
                }
                else {
                  p_Var7 = context->args->filter;
                  if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var7)(&local_27c0);
                  }
                  uVar25 = vptestmd_avx512vl(local_2800,local_2800);
                  uVar25 = uVar25 & 0xf;
                  bVar24 = (byte)uVar25;
                  if (bVar24 == 0) goto LAB_00846a22;
                  iVar22 = *(int *)(local_27c0.hit + 4);
                  iVar21 = *(int *)(local_27c0.hit + 8);
                  iVar20 = *(int *)(local_27c0.hit + 0xc);
                  bVar10 = (bool)((byte)(uVar25 >> 1) & 1);
                  bVar8 = (bool)((byte)(uVar25 >> 2) & 1);
                  bVar9 = SUB81(uVar25 >> 3,0);
                  *(uint *)(local_27c0.ray + 0xc0) =
                       (uint)(bVar24 & 1) * *(int *)local_27c0.hit |
                       (uint)!(bool)(bVar24 & 1) * *(int *)(local_27c0.ray + 0xc0);
                  *(uint *)(local_27c0.ray + 0xc4) =
                       (uint)bVar10 * iVar22 | (uint)!bVar10 * *(int *)(local_27c0.ray + 0xc4);
                  *(uint *)(local_27c0.ray + 200) =
                       (uint)bVar8 * iVar21 | (uint)!bVar8 * *(int *)(local_27c0.ray + 200);
                  *(uint *)(local_27c0.ray + 0xcc) =
                       (uint)bVar9 * iVar20 | (uint)!bVar9 * *(int *)(local_27c0.ray + 0xcc);
                  iVar22 = *(int *)(local_27c0.hit + 0x14);
                  iVar21 = *(int *)(local_27c0.hit + 0x18);
                  iVar20 = *(int *)(local_27c0.hit + 0x1c);
                  bVar10 = (bool)((byte)(uVar25 >> 1) & 1);
                  bVar8 = (bool)((byte)(uVar25 >> 2) & 1);
                  bVar9 = SUB81(uVar25 >> 3,0);
                  *(uint *)(local_27c0.ray + 0xd0) =
                       (uint)(bVar24 & 1) * *(int *)(local_27c0.hit + 0x10) |
                       (uint)!(bool)(bVar24 & 1) * *(int *)(local_27c0.ray + 0xd0);
                  *(uint *)(local_27c0.ray + 0xd4) =
                       (uint)bVar10 * iVar22 | (uint)!bVar10 * *(int *)(local_27c0.ray + 0xd4);
                  *(uint *)(local_27c0.ray + 0xd8) =
                       (uint)bVar8 * iVar21 | (uint)!bVar8 * *(int *)(local_27c0.ray + 0xd8);
                  *(uint *)(local_27c0.ray + 0xdc) =
                       (uint)bVar9 * iVar20 | (uint)!bVar9 * *(int *)(local_27c0.ray + 0xdc);
                  iVar22 = *(int *)(local_27c0.hit + 0x24);
                  iVar21 = *(int *)(local_27c0.hit + 0x28);
                  iVar20 = *(int *)(local_27c0.hit + 0x2c);
                  bVar10 = (bool)((byte)(uVar25 >> 1) & 1);
                  bVar8 = (bool)((byte)(uVar25 >> 2) & 1);
                  bVar9 = SUB81(uVar25 >> 3,0);
                  *(uint *)(local_27c0.ray + 0xe0) =
                       (uint)(bVar24 & 1) * *(int *)(local_27c0.hit + 0x20) |
                       (uint)!(bool)(bVar24 & 1) * *(int *)(local_27c0.ray + 0xe0);
                  *(uint *)(local_27c0.ray + 0xe4) =
                       (uint)bVar10 * iVar22 | (uint)!bVar10 * *(int *)(local_27c0.ray + 0xe4);
                  *(uint *)(local_27c0.ray + 0xe8) =
                       (uint)bVar8 * iVar21 | (uint)!bVar8 * *(int *)(local_27c0.ray + 0xe8);
                  *(uint *)(local_27c0.ray + 0xec) =
                       (uint)bVar9 * iVar20 | (uint)!bVar9 * *(int *)(local_27c0.ray + 0xec);
                  iVar22 = *(int *)(local_27c0.hit + 0x34);
                  iVar21 = *(int *)(local_27c0.hit + 0x38);
                  iVar20 = *(int *)(local_27c0.hit + 0x3c);
                  bVar10 = (bool)((byte)(uVar25 >> 1) & 1);
                  bVar8 = (bool)((byte)(uVar25 >> 2) & 1);
                  bVar9 = SUB81(uVar25 >> 3,0);
                  *(uint *)(local_27c0.ray + 0xf0) =
                       (uint)(bVar24 & 1) * *(int *)(local_27c0.hit + 0x30) |
                       (uint)!(bool)(bVar24 & 1) * *(int *)(local_27c0.ray + 0xf0);
                  *(uint *)(local_27c0.ray + 0xf4) =
                       (uint)bVar10 * iVar22 | (uint)!bVar10 * *(int *)(local_27c0.ray + 0xf4);
                  *(uint *)(local_27c0.ray + 0xf8) =
                       (uint)bVar8 * iVar21 | (uint)!bVar8 * *(int *)(local_27c0.ray + 0xf8);
                  *(uint *)(local_27c0.ray + 0xfc) =
                       (uint)bVar9 * iVar20 | (uint)!bVar9 * *(int *)(local_27c0.ray + 0xfc);
                  iVar22 = *(int *)(local_27c0.hit + 0x44);
                  iVar21 = *(int *)(local_27c0.hit + 0x48);
                  iVar20 = *(int *)(local_27c0.hit + 0x4c);
                  bVar10 = (bool)((byte)(uVar25 >> 1) & 1);
                  bVar8 = (bool)((byte)(uVar25 >> 2) & 1);
                  bVar9 = SUB81(uVar25 >> 3,0);
                  *(uint *)(local_27c0.ray + 0x100) =
                       (uint)(bVar24 & 1) * *(int *)(local_27c0.hit + 0x40) |
                       (uint)!(bool)(bVar24 & 1) * *(int *)(local_27c0.ray + 0x100);
                  *(uint *)(local_27c0.ray + 0x104) =
                       (uint)bVar10 * iVar22 | (uint)!bVar10 * *(int *)(local_27c0.ray + 0x104);
                  *(uint *)(local_27c0.ray + 0x108) =
                       (uint)bVar8 * iVar21 | (uint)!bVar8 * *(int *)(local_27c0.ray + 0x108);
                  *(uint *)(local_27c0.ray + 0x10c) =
                       (uint)bVar9 * iVar20 | (uint)!bVar9 * *(int *)(local_27c0.ray + 0x10c);
                  auVar33 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_27c0.hit + 0x50));
                  *(undefined1 (*) [16])(local_27c0.ray + 0x110) = auVar33;
                  auVar33 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_27c0.hit + 0x60));
                  *(undefined1 (*) [16])(local_27c0.ray + 0x120) = auVar33;
                  auVar33 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_27c0.hit + 0x70));
                  *(undefined1 (*) [16])(local_27c0.ray + 0x130) = auVar33;
                  auVar33 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_27c0.hit + 0x80));
                  *(undefined1 (*) [16])(local_27c0.ray + 0x140) = auVar33;
                }
                auVar55 = ZEXT3264(local_26c0);
                uVar52 = *(undefined4 *)(ray + k * 4 + 0x80);
                auVar17._4_4_ = uVar52;
                auVar17._0_4_ = uVar52;
                auVar17._8_4_ = uVar52;
                auVar17._12_4_ = uVar52;
                auVar17._16_4_ = uVar52;
                auVar17._20_4_ = uVar52;
                auVar17._24_4_ = uVar52;
                auVar17._28_4_ = uVar52;
                uVar14 = vcmpps_avx512vl(local_26c0,auVar17,2);
                uVar31 = (uint)(byte)(~(byte)(1 << (uVar72 & 0x1f)) & (byte)uVar31) & (uint)uVar14;
                bVar10 = true;
                auVar78 = ZEXT3264(local_25e0);
                auVar79 = ZEXT3264(local_2600);
                auVar80 = ZEXT3264(local_2620);
                auVar35 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar81 = ZEXT3264(auVar35);
                auVar82 = ZEXT3264(local_2640);
                auVar83 = ZEXT3264(local_2660);
                auVar84 = ZEXT3264(local_2680);
                auVar35 = vmovdqa64_avx512vl(local_26a0);
                auVar85 = ZEXT3264(auVar35);
                auVar33 = vmovdqa64_avx512vl(local_2790);
                auVar86 = ZEXT1664(auVar33);
                auVar35 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
                auVar87 = ZEXT3264(auVar35);
                auVar35 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
                auVar88 = ZEXT3264(auVar35);
                auVar33 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
                auVar89 = ZEXT1664(auVar33);
              }
              if (!bVar10) {
                uVar25 = (ulong)(uVar28 << 2);
                uVar5 = *(undefined4 *)(local_2480 + uVar25);
                uVar52 = *(undefined4 *)(local_2460 + uVar25);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2440 + uVar25);
                *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2420 + uVar25);
                *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2400 + uVar25);
                *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_23e0 + uVar25);
                *(undefined4 *)(ray + k * 4 + 0xf0) = uVar5;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar52;
                *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_2780 + uVar25);
                *(uint *)(ray + k * 4 + 0x120) = uVar71;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                break;
              }
              bVar24 = (byte)uVar31;
              if (bVar24 == 0) break;
              auVar54._8_4_ = 0x7f800000;
              auVar54._0_8_ = 0x7f8000007f800000;
              auVar54._12_4_ = 0x7f800000;
              auVar54._16_4_ = 0x7f800000;
              auVar54._20_4_ = 0x7f800000;
              auVar54._24_4_ = 0x7f800000;
              auVar54._28_4_ = 0x7f800000;
              auVar35 = vblendmps_avx512vl(auVar54,auVar55._0_32_);
              auVar51._0_4_ =
                   (uint)(bVar24 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar24 & 1) * 0x7f800000;
              bVar10 = (bool)((byte)(uVar31 >> 1) & 1);
              auVar51._4_4_ = (uint)bVar10 * auVar35._4_4_ | (uint)!bVar10 * 0x7f800000;
              bVar10 = (bool)((byte)(uVar31 >> 2) & 1);
              auVar51._8_4_ = (uint)bVar10 * auVar35._8_4_ | (uint)!bVar10 * 0x7f800000;
              bVar10 = (bool)((byte)(uVar31 >> 3) & 1);
              auVar51._12_4_ = (uint)bVar10 * auVar35._12_4_ | (uint)!bVar10 * 0x7f800000;
              bVar10 = (bool)((byte)(uVar31 >> 4) & 1);
              auVar51._16_4_ = (uint)bVar10 * auVar35._16_4_ | (uint)!bVar10 * 0x7f800000;
              bVar10 = (bool)((byte)(uVar31 >> 5) & 1);
              auVar51._20_4_ = (uint)bVar10 * auVar35._20_4_ | (uint)!bVar10 * 0x7f800000;
              bVar10 = (bool)((byte)(uVar31 >> 6) & 1);
              auVar51._24_4_ = (uint)bVar10 * auVar35._24_4_ | (uint)!bVar10 * 0x7f800000;
              auVar51._28_4_ =
                   (uVar31 >> 7) * auVar35._28_4_ | (uint)!SUB41(uVar31 >> 7,0) * 0x7f800000;
              auVar35 = vshufps_avx(auVar51,auVar51,0xb1);
              auVar35 = vminps_avx(auVar51,auVar35);
              auVar36 = vshufpd_avx(auVar35,auVar35,5);
              auVar35 = vminps_avx(auVar35,auVar36);
              auVar36 = vpermpd_avx2(auVar35,0x4e);
              auVar35 = vminps_avx(auVar35,auVar36);
              uVar14 = vcmpps_avx512vl(auVar51,auVar35,0);
              bVar24 = (byte)uVar14 & bVar24;
            } while( true );
          }
        }
        lVar30 = lVar30 + 1;
      } while (lVar30 != local_27d0);
    }
    uVar52 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar55 = ZEXT3264(CONCAT428(uVar52,CONCAT424(uVar52,CONCAT420(uVar52,CONCAT416(uVar52,CONCAT412
                                                  (uVar52,CONCAT48(uVar52,CONCAT44(uVar52,uVar52))))
                                                  ))));
    in_ZMM8 = ZEXT3264(local_25c0);
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }